

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::ByteBuffer*>
          (BaseDictionary<Js::ByteBuffer*,Js::IndexEntry,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,ByteBuffer **key)

{
  uint uVar1;
  long lVar2;
  ByteBuffer *pBVar3;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint depth;
  uint uVar8;
  uint uVar9;
  hash_t hVar10;
  DictionaryStats *this_00;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    uVar6 = (ulong)(*key)->byteCount;
    if (uVar6 == 0) {
      hVar10 = 0x11c9dc5;
    }
    else {
      uVar8 = 0x811c9dc5;
      uVar7 = 0;
      do {
        uVar9 = (int)*(char *)((long)((*key)->field_1).pv + uVar7) ^ uVar8;
        uVar8 = uVar9 * 0x1000193;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      hVar10 = uVar9 * 0x2000326 >> 1;
    }
    hVar10 = PrimePolicy::ModPrime(hVar10,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar8 = *(uint *)(lVar2 + (ulong)hVar10 * 4);
    depth = 0;
    if (-1 < (int)uVar8) {
      lVar2 = *(long *)(this + 8);
      pBVar3 = *key;
      uVar9 = pBVar3->byteCount;
      depth = 0;
      do {
        puVar4 = *(uint **)(lVar2 + 0x18 + (ulong)uVar8 * 0x20);
        uVar1 = *puVar4;
        if (uVar1 == uVar9) {
          iVar5 = bcmp(*(void **)(puVar4 + 2),(pBVar3->field_1).pv,(ulong)uVar1);
          if (iVar5 == 0) {
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_00881eb1;
          }
        }
        depth = depth + 1;
        uVar8 = *(uint *)((ulong)uVar8 * 0x20 + lVar2 + 0x10);
      } while (-1 < (int)uVar8);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar8 = 0xffffffff;
LAB_00881eb1:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return uVar8;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }